

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall luna::CodeGenerateVisitor::LeaveBlock(CodeGenerateVisitor *this)

{
  bool bVar1;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false> this_00;
  pointer ppVar2;
  long in_RDI;
  Instruction instruction;
  iterator it;
  size_t end_pc;
  Function *function;
  GenerateBlock *block;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  _Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
  *in_stack_ffffffffffffffa0;
  undefined8 *puVar3;
  Function *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  Instruction i;
  int end_pc_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false> local_28;
  size_t local_20;
  Function *local_18;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(*(long *)(in_RDI + 0x10) + 8);
  local_18 = *(Function **)(*(long *)(in_RDI + 0x10) + 0x10);
  local_20 = Function::OpCodeSize((Function *)0x2207e7);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
       ::begin((unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    i.opcode_ = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    this_00._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
         ::end((unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                        *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 = local_18;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>::
             operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                         *)0x22083b);
    in_stack_ffffffffffffffb0 = ppVar2->first;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>::
             operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                         *)0x22084d);
    end_pc_00 = (ppVar2->second).register_id_;
    std::__detail::_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
    ::operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                  *)0x22085e);
    Function::AddLocalVar
              ((Function *)this_00._M_cur,
               (String *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,end_pc_00);
    std::__detail::_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
    ::operator++(in_stack_ffffffffffffffa0);
  }
  Instruction::ABCode((OpType)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
  Function::AddInstruction
            (in_stack_ffffffffffffffa8,i,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8) = *local_10;
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x1c) = *(undefined4 *)(local_10 + 1);
  if (local_10 != (undefined8 *)0x0) {
    puVar3 = local_10;
    GenerateBlock::~GenerateBlock((GenerateBlock *)0x220903);
    operator_delete(puVar3);
  }
  return;
}

Assistant:

void LeaveBlock()
        {
            auto block = current_function_->current_block_;

            // Add all variables in block to the function local variable list
            auto function = current_function_->function_;
            auto end_pc = function->OpCodeSize();
            for (auto it = block->names_.begin(); it != block->names_.end(); ++it)
            {
                function->AddLocalVar(it->first, it->second.register_id_,
                                      it->second.begin_pc_, end_pc);
            }

            // add one instruction to close block
            auto instruction = Instruction::ABCode(OpType_FillNil, block->register_start_id_, current_function_->register_id_);
            function->AddInstruction(instruction, 0);

            current_function_->current_block_ = block->parent_;
            current_function_->register_id_ = block->register_start_id_;
            delete block;
        }